

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_2::ReservedCheck(ValidationState_t *_,Instruction *inst)

{
  AssemblyGrammar *this;
  DiagnosticStream *pDVar1;
  DiagnosticStream local_208;
  spv_opcode_desc local_30;
  spv_opcode_desc inst_desc;
  Instruction *pIStack_20;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  inst_desc._4_4_ = val::Instruction::opcode(inst);
  if (inst_desc._4_4_ - OpImageSparseSampleProjImplicitLod < 4) {
    this = ValidationState_t::grammar((ValidationState_t *)inst_local);
    AssemblyGrammar::lookupOpcode(this,inst_desc._4_4_,&local_30);
    ValidationState_t::diag
              (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_BINARY,pIStack_20);
    pDVar1 = DiagnosticStream::operator<<(&local_208,(char (*) [24])"Invalid Opcode name \'Op");
    pDVar1 = DiagnosticStream::operator<<(pDVar1,&local_30->name);
    pDVar1 = DiagnosticStream::operator<<(pDVar1,(char (*) [2])0xe2ad32);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar1);
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  else {
    __local._4_4_ = SPV_SUCCESS;
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ReservedCheck(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  switch (opcode) {
    // These instructions are enabled by a capability, but should never
    // be used anyway.
    case spv::Op::OpImageSparseSampleProjImplicitLod:
    case spv::Op::OpImageSparseSampleProjExplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefImplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefExplicitLod: {
      spv_opcode_desc inst_desc;
      _.grammar().lookupOpcode(opcode, &inst_desc);
      return _.diag(SPV_ERROR_INVALID_BINARY, inst)
             << "Invalid Opcode name 'Op" << inst_desc->name << "'";
    }
    default:
      break;
  }
  return SPV_SUCCESS;
}